

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O2

int __thiscall
FormatTypeHFE::LoadDisk
          (FormatTypeHFE *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  IDisk *this_00;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  MFMTrack *pMVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uchar *puVar15;
  int side;
  size_t __n;
  ulong uVar16;
  uchar buf [512];
  
  if (*(long *)buffer == 0x4546434950435848) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[9];
    bVar2 = buffer[10];
    this_00->nb_sides_ = bVar2;
    for (lVar14 = 0; (ulong)bVar2 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
      *(uint *)((long)&this_00->side_[0].nb_tracks + lVar14) = (uint)bVar1;
      pvVar5 = operator_new__((ulong)bVar1 << 5);
      *(void **)((long)&this_00->side_[0].tracks + lVar14) = pvVar5;
      memset(pvVar5,0,(ulong)bVar1 << 5);
    }
    pvVar5 = operator_new__((ulong)bVar1 << 2);
    memcpy(pvVar5,buffer + 0x200,(ulong)bVar1 << 2);
    for (uVar10 = 0; uVar10 != (uint)bVar1; uVar10 = uVar10 + 1) {
      uVar3 = *(ushort *)((long)pvVar5 + uVar10 * 4);
      uVar4 = *(ushort *)((long)pvVar5 + uVar10 * 4 + 2);
      uVar16 = (ulong)(uVar4 >> 1);
      pvVar6 = operator_new__(uVar16);
      pvVar7 = operator_new__(uVar16);
      puVar15 = buffer + (ulong)uVar3 * 0x200;
      iVar12 = 0;
      while (uVar13 = (uint)uVar16, 0 < (int)uVar13) {
        memcpy(buf,puVar15,0x200);
        __n = 0x100;
        if (uVar13 < 0x100) {
          __n = uVar16;
        }
        memcpy((void *)((long)pvVar6 + (long)iVar12),buf,__n);
        memcpy((void *)((long)pvVar7 + (long)iVar12),buf + 0x100,__n);
        iVar12 = iVar12 + (int)__n;
        puVar15 = puVar15 + 0x200;
        uVar16 = (ulong)(uVar13 - (int)__n);
      }
      uVar13 = (uint)uVar4 * 4;
      for (uVar16 = 0; uVar16 < this_00->nb_sides_; uVar16 = uVar16 + 1) {
        pMVar11 = this_00->side_[uVar16].tracks;
        pMVar11[uVar10].size = uVar13;
        puVar15 = (uchar *)operator_new__((ulong)uVar13);
        pMVar11[uVar10].bitfield = puVar15;
        pvVar8 = pvVar7;
        if (uVar16 == 0) {
          pvVar8 = pvVar6;
        }
        for (uVar9 = 0; uVar9 < pMVar11[uVar10].size; uVar9 = uVar9 + 1) {
          pMVar11[uVar10].bitfield[uVar9] =
               (*(byte *)((long)pvVar8 + (uVar9 >> 3)) >> ((uint)uVar9 & 7) & 1) != 0;
          pMVar11 = this_00->side_[uVar16].tracks;
        }
      }
      operator_delete__(pvVar6);
      operator_delete__(pvVar7);
    }
    operator_delete__(pvVar5);
    *created_disk = this_00;
    iVar12 = 0;
  }
  else {
    iVar12 = -1;
  }
  return iVar12;
}

Assistant:

int FormatTypeHFE::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "HXCPICFE", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Header
      int index_buffer = 0;

      Picfileformatheader header;
      //fread(&header, 1, sizeof(header), file);
      memcpy(&header, buffer, sizeof(header));
      index_buffer += sizeof(header);

      // Number of sides
      new_disk->nb_sides_ = header.number_of_side;

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = header.number_of_track;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[new_disk->side_[side].nb_tracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * new_disk->side_[side].nb_tracks);
      }

      //fseek(file, 0x200, SEEK_SET);
      index_buffer = 0x200;

      Pictrack* pck_trk = new Pictrack[header.number_of_track];
      //fread(pck_trk, 1, sizeof(pck_trk) * header.number_of_track, file);
      memcpy(pck_trk, &buffer[index_buffer], sizeof(Pictrack) * header.number_of_track);
      index_buffer += sizeof(pck_trk) * header.number_of_track;

      // Second part : (up to 1024 bytes) : Track offset LUT
      unsigned char* buffer1;
      unsigned char* buffer2;
      for (int track = 0; track < header.number_of_track; track++)
      {
         // Track data
         //fseek(file, 0x200 * pck_trk[track].offset, SEEK_SET);
         index_buffer = 0x200 * pck_trk[track].offset;

         // Read bytes
         buffer1 = new unsigned char[pck_trk[track].track_len / 2];
         buffer2 = new unsigned char[pck_trk[track].track_len / 2];

         int byte_to_read = pck_trk[track].track_len / 2;
         unsigned char buf[0x200];
         int index = 0;
         while (byte_to_read > 0)
         {
            //fread(buf, 1, 0x200, file);
            memcpy(buf, &buffer[index_buffer], 0x200);
            index_buffer += 0x200;

            unsigned int cnt = (byte_to_read < 0x100) ? byte_to_read : 0x100;

            memcpy(&buffer1[index], buf, cnt);
            memcpy(&buffer2[index], &buf[0x100], cnt);

            byte_to_read -= cnt;
            index += cnt;
         }


         for (int side = 0; side < new_disk->nb_sides_; side++)
         {
            new_disk->side_[side].tracks[track].size = pck_trk[track].track_len * 4;
            new_disk->side_[side].tracks[track].bitfield = new unsigned char[new_disk->side_[side].
               tracks[track].size];

            // TODO : Multiple side
            for (unsigned int i = 0; i < new_disk->side_[side].tracks[track].size; i++)
            {
               new_disk->side_[side].tracks[track].bitfield[i] = (((side == 0) ? buffer1 : buffer2)[
                  i >> 3]) >> ((i & 7)) & 1;
            }
         }
         delete[]buffer1;
         delete[]buffer2;
      }

      delete[]pck_trk;

      created_disk = new_disk;
      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}